

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

void anon_unknown.dwarf_783c::closeAndReset(TSocketDescriptor *sock)

{
  if (*sock != -1) {
    shutdown(*sock,0);
    close(*sock);
    *sock = -1;
  }
  return;
}

Assistant:

void closeAndReset(TSocketDescriptor & sock) {
        if (sock != -1) {
#ifndef __EMSCRIPTEN__
            shutdown(sock, 0);
#endif
            close(sock);
            sock = -1;
        }
    }